

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t * convert_run_optimize(container_t *c,uint8_t typecode_original,uint8_t *typecode_after)

{
  ushort uVar1;
  int iVar2;
  ulong *puVar3;
  rle16_t *prVar4;
  long lVar5;
  long lVar6;
  short sVar7;
  int32_t size;
  int iVar8;
  run_container_t *prVar9;
  ulong uVar10;
  long lVar11;
  uint16_t uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined7 in_register_00000031;
  ulong uVar16;
  uint uVar17;
  bool bVar18;
  
  iVar8 = (int)CONCAT71(in_register_00000031,typecode_original);
  prVar9 = (run_container_t *)c;
  if (iVar8 == 2) {
    size = array_container_number_of_runs((array_container_t *)c);
    uVar15 = *c;
    if (SBORROW4(size * 4,uVar15 * 2) == (int)(size * 4 + uVar15 * -2) < 0) {
      *typecode_after = '\x02';
    }
    else {
      prVar9 = run_container_create_given_capacity(size);
      uVar10 = 0;
      uVar16 = (ulong)uVar15;
      if ((int)uVar15 < 1) {
        uVar16 = uVar10;
      }
      uVar15 = 0xfffffffe;
      uVar13 = 0xffffffff;
      while( true ) {
        uVar12 = (uint16_t)uVar13;
        sVar7 = (short)uVar15;
        if (uVar16 == uVar10) break;
        lVar11 = *(long *)((long)c + 8);
        uVar1 = *(ushort *)(lVar11 + uVar10 * 2);
        uVar14 = (uint)uVar1;
        uVar17 = uVar15 + 1;
        uVar15 = uVar14;
        if ((uVar17 != uVar1) &&
           (bVar18 = uVar13 != 0xffffffff, uVar13 = uVar14, uVar15 = (uint)uVar1, bVar18)) {
          prVar4 = prVar9->runs;
          iVar8 = prVar9->n_runs;
          prVar4[iVar8].value = uVar12;
          prVar4[iVar8].length = sVar7 - uVar12;
          prVar9->n_runs = iVar8 + 1;
          uVar15 = (uint)*(ushort *)(lVar11 + uVar10 * 2);
        }
        uVar10 = uVar10 + 1;
      }
      prVar4 = prVar9->runs;
      iVar8 = prVar9->n_runs;
      prVar4[iVar8].value = uVar12;
      prVar4[iVar8].length = sVar7 - uVar12;
      prVar9->n_runs = iVar8 + 1;
      *typecode_after = '\x03';
      array_container_free((array_container_t *)c);
    }
  }
  else if (iVar8 == 3) {
    prVar9 = (run_container_t *)
             convert_run_to_efficient_container((run_container_t *)c,typecode_after);
    if (prVar9 != (run_container_t *)c) {
      container_free(c,'\x03');
    }
  }
  else {
    iVar8 = bitset_container_number_of_runs((bitset_container_t *)c);
    if (iVar8 * 4 + 2 < 0x2000) {
      prVar9 = run_container_create_given_capacity(iVar8);
      puVar3 = *(ulong **)((long)c + 8);
      uVar16 = *puVar3;
      lVar11 = 0;
      while( true ) {
        uVar15 = (int)lVar11 * -0x40 & 0xffff;
        for (lVar11 = (long)(int)lVar11; (uVar16 == 0 && (lVar11 < 0x3ff)); lVar11 = lVar11 + 1) {
          uVar16 = puVar3[lVar11 + 1];
          uVar15 = uVar15 - 0x40;
        }
        if (uVar16 == 0) goto LAB_00111630;
        lVar5 = 0;
        if (uVar16 != 0) {
          for (; (uVar16 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
          }
        }
        uVar16 = uVar16 - 1 | uVar16;
        iVar8 = 0x3f - (int)lVar5;
        for (; (uVar16 == 0xffffffffffffffff && (lVar11 < 0x3ff)); lVar11 = lVar11 + 1) {
          uVar16 = puVar3[lVar11 + 1];
          iVar8 = iVar8 + 0x40;
        }
        if (uVar16 == 0xffffffffffffffff) break;
        lVar6 = 0;
        if (~uVar16 != 0) {
          for (; (~uVar16 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        prVar4 = prVar9->runs;
        iVar2 = prVar9->n_runs;
        prVar4[iVar2].value = (short)lVar5 - (short)uVar15;
        prVar4[iVar2].length = ((uint16_t)iVar8 + (short)lVar6) - 0x40;
        prVar9->n_runs = iVar2 + 1;
        uVar16 = uVar16 + 1 & uVar16;
      }
      prVar4 = prVar9->runs;
      iVar2 = prVar9->n_runs;
      prVar4[iVar2].value = (short)lVar5 - (short)uVar15;
      prVar4[iVar2].length = (uint16_t)iVar8;
      prVar9->n_runs = iVar2 + 1;
LAB_00111630:
      bitset_container_free((bitset_container_t *)c);
      *typecode_after = '\x03';
    }
    else {
      *typecode_after = '\x01';
    }
  }
  return prVar9;
}

Assistant:

container_t *convert_run_optimize(container_t *c, uint8_t typecode_original,
                                  uint8_t *typecode_after) {
    if (typecode_original == RUN_CONTAINER_TYPE) {
        container_t *newc =
            convert_run_to_efficient_container(CAST_run(c), typecode_after);
        if (newc != c) {
            container_free(c, typecode_original);
        }
        return newc;
    } else if (typecode_original == ARRAY_CONTAINER_TYPE) {
        // it might need to be converted to a run container.
        array_container_t *c_qua_array = CAST_array(c);
        int32_t n_runs = array_container_number_of_runs(c_qua_array);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t card = array_container_cardinality(c_qua_array);
        int32_t size_as_array_container =
            array_container_serialized_size_in_bytes(card);

        if (size_as_run_container >= size_as_array_container) {
            *typecode_after = ARRAY_CONTAINER_TYPE;
            return c;
        }
        // else convert array to run container
        run_container_t *answer = run_container_create_given_capacity(n_runs);
        int prev = -2;
        int run_start = -1;

        assert(card > 0);
        for (int i = 0; i < card; ++i) {
            uint16_t cur_val = c_qua_array->array[i];
            if (cur_val != prev + 1) {
                // new run starts; flush old one, if any
                if (run_start != -1) add_run(answer, run_start, prev);
                run_start = cur_val;
            }
            prev = c_qua_array->array[i];
        }
        assert(run_start >= 0);
        // now prev is the last seen value
        add_run(answer, run_start, prev);
        *typecode_after = RUN_CONTAINER_TYPE;
        array_container_free(c_qua_array);
        return answer;
    } else if (typecode_original ==
               BITSET_CONTAINER_TYPE) {  // run conversions on bitset
        // does bitset need conversion to run?
        bitset_container_t *c_qua_bitset = CAST_bitset(c);
        int32_t n_runs = bitset_container_number_of_runs(c_qua_bitset);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t size_as_bitset_container =
            bitset_container_serialized_size_in_bytes();

        if (size_as_bitset_container <= size_as_run_container) {
            // no conversion needed.
            *typecode_after = BITSET_CONTAINER_TYPE;
            return c;
        }
        // bitset to runcontainer (ported from Java  RunContainer(
        // BitmapContainer bc, int nbrRuns))
        assert(n_runs > 0);  // no empty bitmaps
        run_container_t *answer = run_container_create_given_capacity(n_runs);

        int long_ctr = 0;
        uint64_t cur_word = c_qua_bitset->words[0];
        while (true) {
            while (cur_word == UINT64_C(0) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word = c_qua_bitset->words[++long_ctr];

            if (cur_word == UINT64_C(0)) {
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }

            int local_run_start = roaring_trailing_zeroes(cur_word);
            int run_start = local_run_start + 64 * long_ctr;
            uint64_t cur_word_with_1s = cur_word | (cur_word - 1);

            int run_end = 0;
            while (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word_with_1s = c_qua_bitset->words[++long_ctr];

            if (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF)) {
                run_end = 64 + long_ctr * 64;  // exclusive, I guess
                add_run(answer, run_start, run_end - 1);
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }
            int local_run_end = roaring_trailing_zeroes(~cur_word_with_1s);
            run_end = local_run_end + long_ctr * 64;
            add_run(answer, run_start, run_end - 1);
            cur_word = cur_word_with_1s & (cur_word_with_1s + 1);
        }
        return answer;
    } else {
        assert(false);
        roaring_unreachable;
        return NULL;
    }
}